

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridAxisIrregular.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::GridAxisIrregular::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,GridAxisIrregular *this)

{
  ushort *puVar1;
  ostream *poVar2;
  ushort *puVar3;
  KStringStream ss;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  poVar2 = std::operator<<(local_1a0,"Grid Axis Irregular:");
  std::operator<<(poVar2,"\n\tDomain Initial Xi:    ");
  poVar2 = std::ostream::_M_insert<double>
                     ((double)(this->super_GridAxisRegular).m_f64DomainInitialXi);
  std::operator<<(poVar2,"\n\tDomain Final Xi:      ");
  poVar2 = std::ostream::_M_insert<double>((double)(this->super_GridAxisRegular).m_f64DomainFinalXi)
  ;
  poVar2 = std::operator<<(poVar2,"\n\tDomain Points Xi:     ");
  poVar2 = (ostream *)
           std::ostream::operator<<(poVar2,(this->super_GridAxisRegular).m_ui16DomainPointsXi);
  poVar2 = std::operator<<(poVar2,"\n\tInterleaf Factor:     ");
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,(ushort)(this->super_GridAxisRegular).m_ui8InterleafFactor);
  poVar2 = std::operator<<(poVar2,"\n\tAxis Type:            ");
  poVar2 = (ostream *)
           std::ostream::operator<<(poVar2,(ushort)(this->super_GridAxisRegular).m_ui8AxisType);
  poVar2 = std::operator<<(poVar2,"\n\tNumber Of Points:     ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->super_GridAxisRegular).m_ui16NumPoints)
  ;
  poVar2 = std::operator<<(poVar2,"\n\tInitial Index:        ");
  poVar2 = (ostream *)
           std::ostream::operator<<(poVar2,(this->super_GridAxisRegular).m_ui16InitialIndex);
  std::operator<<(poVar2,"\n\tCoordinate Scale Xi:  ");
  poVar2 = std::ostream::_M_insert<double>((double)this->m_f64CoordScaleXi);
  std::operator<<(poVar2,"\n\tCoordinate Offset Xi: ");
  poVar2 = std::ostream::_M_insert<double>((double)this->m_f64CoordOffsetXi);
  std::operator<<(poVar2,"\n\tXi Values:");
  puVar1 = (this->m_vXiValues).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (puVar3 = (this->m_vXiValues).
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    poVar2 = std::operator<<(local_1a0,"\n\t");
    std::ostream::operator<<(poVar2,*puVar3);
  }
  std::operator<<(local_1a0,"\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

KString GridAxisIrregular::GetAsString() const
{
    KStringStream ss;

    ss << "Grid Axis Irregular:"
       << "\n\tDomain Initial Xi:    " << m_f64DomainInitialXi
       << "\n\tDomain Final Xi:      " << m_f64DomainFinalXi
       << "\n\tDomain Points Xi:     " << m_ui16DomainPointsXi
       << "\n\tInterleaf Factor:     " << ( KUINT16 )m_ui8InterleafFactor
       << "\n\tAxis Type:            " << ( KUINT16 )m_ui8AxisType
       << "\n\tNumber Of Points:     " << m_ui16NumPoints
       << "\n\tInitial Index:        " << m_ui16InitialIndex
       << "\n\tCoordinate Scale Xi:  " << m_f64CoordScaleXi
       << "\n\tCoordinate Offset Xi: " << m_f64CoordOffsetXi
       << "\n\tXi Values:";

    vector<KUINT16>::const_iterator citr = m_vXiValues.begin();
    vector<KUINT16>::const_iterator citrEnd = m_vXiValues.end();

    for( ; citr != citrEnd; ++citr )
    {
        ss << "\n\t" << *citr;
    }

    ss << "\n";

    return ss.str();
}